

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_field_info.h
# Opt level: O1

iterator_range<google::protobuf::internal::RepeatedPtrIterator<google::protobuf::Message>_>
__thiscall
google::protobuf::internal::
RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>::Mutable
          (RepeatedPtrEntityDynamicFieldInfoBase<google::protobuf::Message,_google::protobuf::Message>
           *this)

{
  RepeatedPtrFieldBase *this_00;
  Rep *pRVar1;
  RepeatedPtrFieldBase *pRVar2;
  int in_R8D;
  RepeatedPtrIterator<google::protobuf::Message> RVar3;
  iterator_range<google::protobuf::internal::RepeatedPtrIterator<google::protobuf::Message>_> iVar4;
  
  this_00 = (RepeatedPtrFieldBase *)
            Reflection::MutableRawRepeatedField
                      (this->reflection,this->message,this->field,CPPTYPE_MESSAGE,in_R8D,
                       (Descriptor *)0x0);
  RVar3.it_ = (void **)this_00;
  if (((ulong)this_00->tagged_rep_or_elem_ & 1) != 0) {
    pRVar1 = RepeatedPtrFieldBase::rep(this_00);
    RVar3.it_ = pRVar1->elements;
  }
  pRVar2 = this_00;
  if (((ulong)this_00->tagged_rep_or_elem_ & 1) != 0) {
    pRVar1 = RepeatedPtrFieldBase::rep(this_00);
    pRVar2 = (RepeatedPtrFieldBase *)pRVar1->elements;
  }
  iVar4.end_iterator_.it_ = &pRVar2->tagged_rep_or_elem_ + this_00->current_size_;
  iVar4.begin_iterator_.it_ = RVar3.it_;
  return iVar4;
}

Assistant:

iterator_range<typename RepeatedPtrField<FieldT>::iterator> Mutable() {
    auto& rep =
        *reflection->MutableRepeatedPtrFieldInternal<FieldT>(&message, field);
    return {rep.begin(), rep.end()};
  }